

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O1

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZGeoMesh *this;
  long lVar1;
  TPZCompEl *pTVar2;
  TPZCompEl **ppTVar3;
  TPZCompEl *this_00;
  long lVar4;
  TPZGeoEl *this_01;
  TPZGeoEl *pTVar5;
  long *plVar6;
  long lVar7;
  long nelem;
  long lVar8;
  TPZGeoEl *gelF;
  bool bVar9;
  TPZStack<TPZCompElSide,_10> celstack;
  undefined **local_f8;
  undefined **local_f0;
  undefined8 *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 auStack_c8 [38];
  
  this = MFMesh->fReference;
  TPZGeoMesh::ResetReference(this);
  lVar1 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  lVar7 = cmeshVec->fNElements;
  if (0 < lVar7) {
    lVar8 = 0;
    local_f8 = &PTR__TPZManVector_01842198;
    do {
      TPZCompMesh::LoadReferences(cmeshVec->fStore[lVar8]);
      if (0 < lVar1) {
        nelem = 0;
        do {
          ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                              (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
          pTVar2 = *ppTVar3;
          if (pTVar2 == (TPZCompEl *)0x0) {
            this_00 = (TPZCompEl *)0x0;
            bVar9 = true;
          }
          else {
            this_00 = (TPZCompEl *)
                      __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0
                                    );
            lVar4 = __dynamic_cast(pTVar2,&TPZCompEl::typeinfo,
                                   &TPZMultiphysicsInterfaceElement::typeinfo,0);
            bVar9 = lVar4 == 0;
          }
          if (this_00 == (TPZCompEl *)0x0) {
            if (bVar9) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                         ,0x5e);
            }
          }
          else {
            this_01 = TPZCompEl::Reference(this_00);
            lVar4 = 0x28;
            do {
              *(undefined8 *)((long)&local_f8 + lVar4) = 0;
              *(undefined4 *)((long)&local_f0 + lVar4) = 0xffffffff;
              lVar4 = lVar4 + 0x10;
            } while (lVar4 != 200);
            local_e8 = &local_d0;
            uStack_e0 = 0;
            local_d8 = 0;
            local_f0 = local_f8;
            (**(code **)(*(long *)this_01 + 0xf0))(this_01);
            if (this_01->fReference == (TPZCompEl *)0x0) {
              do {
                pTVar5 = TPZGeoEl::Father(this_01);
                if (pTVar5 == (TPZGeoEl *)0x0) {
                  (**(code **)(*(long *)this_00 + 0x248))(this_00,0,lVar8);
                  goto LAB_013d462b;
                }
                this_01 = TPZGeoEl::Father(this_01);
              } while (this_01->fReference == (TPZCompEl *)0x0);
              (**(code **)(*(long *)this_00 + 0x248))(this_00,this_01->fReference,lVar8);
            }
            else {
              (**(code **)(*(long *)this_00 + 0x248))(this_00,this_01->fReference,lVar8);
            }
LAB_013d462b:
            if (local_e8 == &local_d0) {
              local_e8 = (undefined8 *)0x0;
            }
            local_d8 = 0;
            local_f0 = &PTR__TPZVec_0183b970;
            if (local_e8 != (undefined8 *)0x0) {
              operator_delete__(local_e8);
            }
          }
          nelem = nelem + 1;
        } while (nelem != lVar1);
      }
      TPZGeoMesh::ResetReference(this);
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
  }
  if (0 < lVar1) {
    lVar7 = 0;
    do {
      ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar7);
      if (*ppTVar3 == (TPZCompEl *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(*ppTVar3,&TPZCompEl::typeinfo,
                                        &TPZMultiphysicsElement::typeinfo,0);
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x220))(plVar6);
      }
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
	TPZGeoMesh *gmesh = MFMesh->Reference();
	gmesh->ResetReference();
	int64_t nMFEl = MFMesh->NElements();
	int64_t nmesh = cmeshVec.size();
	int64_t imesh;
	for(imesh = 0; imesh<nmesh; imesh++)
	{
		cmeshVec[imesh]->LoadReferences();
		int64_t iel;
		for(iel=0; iel<nMFEl; iel++)
		{
            TPZCompEl * cel = MFMesh->ElementVec()[iel];
			TPZMultiphysicsElement * mfcel = dynamic_cast<TPZMultiphysicsElement *> (cel);
            TPZMultiphysicsInterfaceElement * mfint = dynamic_cast<TPZMultiphysicsInterfaceElement *>(cel);
			if(mfcel)
			{
                int64_t found = 0;
                TPZGeoEl * gel = mfcel->Reference();
                TPZStack<TPZCompElSide> celstack;
                TPZGeoElSide gelside(gel,gel->NSides()-1);
                // if the geometric element has a reference, it is an obvious candidate
                if (gel->Reference()) {
                    mfcel->AddElement(gel->Reference(), imesh);
                    continue;
                }
                else
                {
                    TPZGeoEl *gelF = gel;
                    while(gelF->Father())
                    {
                        gelF = gelF->Father();
                        if (gelF->Reference()) {
#ifdef PZDEBUG
                            if (gelF->MaterialId() != gel->MaterialId()) {
                                DebugStop();
                            }
#endif
                            mfcel->AddElement(gelF->Reference(), imesh);
                            found = true;
                            break;
                        }
                    }
                }
                if (!found) {
                    mfcel->AddElement(0, imesh);
                }
            }
            else if (mfint) {
                //set up interface
            }
            else {
                DebugStop();
            }
		}
		gmesh->ResetReference();
	}
    for (int64_t el = 0; el < nMFEl; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->InitializeIntegrationRule();
    }
}